

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
dlib::image_display::on_mouse_up
          (image_display *this,unsigned_long btn,unsigned_long state,long x,long y)

{
  bool bVar1;
  long *plVar2;
  unsigned_long uVar3;
  long in_RCX;
  unsigned_long in_RDX;
  unsigned_long in_RSI;
  scrollable_region *in_RDI;
  long in_R8;
  rectangle new_rect;
  point c2;
  point c1;
  point origin;
  rectangle *in_stack_fffffffffffffe68;
  vector<long,_2L> *in_stack_fffffffffffffe70;
  overlay_rect *this_00;
  double *in_stack_fffffffffffffe80;
  rectangle *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  overlay_rect *in_stack_fffffffffffffe98;
  image_display *in_stack_fffffffffffffea0;
  overlay_rect *in_stack_fffffffffffffea8;
  rgb_alpha_pixel in_stack_fffffffffffffeb4;
  point *in_stack_fffffffffffffed0;
  point *in_stack_fffffffffffffed8;
  rectangle *in_stack_fffffffffffffee0;
  rectangle *in_stack_fffffffffffffee8;
  base_window *in_stack_fffffffffffffef0;
  rectangle local_e8;
  double local_c8;
  double local_b0;
  double local_98;
  double local_80;
  ulong local_18;
  unsigned_long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  scrollable_region::on_mouse_up(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  if ((local_18 & 8) == 0) {
    if (((ulong)in_RDI[1].hsb.bottom_filler.super_button_action.super_mouse_over_event.
                super_drawable._vptr_drawable & 1) != 0) {
      *(undefined1 *)
       &in_RDI[1].hsb.bottom_filler.super_button_action.super_mouse_over_event.super_drawable.
        _vptr_drawable = 0;
      base_window::invalidate_rectangle(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
  }
  else {
    *(undefined1 *)
     &in_RDI[1].hsb.bottom_filler.super_button_action.super_mouse_over_event.super_drawable.
      _vptr_drawable = 1;
  }
  if (((((in_RDI[1].total_rect_.b & 1) != 0) && (local_10 == 1)) && ((local_18 & 8) != 0)) &&
     ((((in_RDI->super_drawable).hidden & 1U) == 0 && (((in_RDI->super_drawable).enabled & 1U) != 0)
      ))) {
    scrollable_region::total_rect(in_RDI);
    rectangle::tl_corner(in_stack_fffffffffffffe88);
    vector<long,_2L>::vector
              ((vector<long,_2L> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (long)in_stack_fffffffffffffe88,(long)in_stack_fffffffffffffe80);
    dlib::operator-((vector<long,_2L> *)in_stack_fffffffffffffe98,
                    (vector<long,_2L> *)
                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    dlib::operator-((vector<long,_2L> *)in_stack_fffffffffffffe98,
                    (vector<long,_2L> *)
                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if (in_RDI[1].total_rect_.t == 1) {
      if (in_RDI[1].total_rect_.r != 1) {
        local_b0 = (double)in_RDI[1].total_rect_.r;
        dlib::operator*((vector<long,_2L> *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        vector<long,2l>::operator=
                  (in_stack_fffffffffffffe70,(vector<double,_2L> *)in_stack_fffffffffffffe68);
        local_c8 = (double)in_RDI[1].total_rect_.r;
        dlib::operator*((vector<long,_2L> *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        vector<long,2l>::operator=
                  (in_stack_fffffffffffffe70,(vector<double,_2L> *)in_stack_fffffffffffffe68);
      }
    }
    else {
      local_80 = (double)in_RDI[1].total_rect_.t;
      vector<long,2l>::operator/
                ((vector<long,_2L> *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      vector<long,2l>::operator=
                (in_stack_fffffffffffffe70,(vector<double,_2L> *)in_stack_fffffffffffffe68);
      local_98 = (double)in_RDI[1].total_rect_.t;
      vector<long,2l>::operator/
                ((vector<long,_2L> *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      vector<long,2l>::operator=
                (in_stack_fffffffffffffe70,(vector<double,_2L> *)in_stack_fffffffffffffe68);
    }
    rectangle::rectangle
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    if (in_RDI[1].total_rect_.t != 1) {
      plVar2 = rectangle::right(&local_e8);
      *plVar2 = *plVar2 + -1;
      plVar2 = rectangle::bottom(&local_e8);
      *plVar2 = *plVar2 + -1;
    }
    uVar3 = rectangle::width(in_stack_fffffffffffffe68);
    if ((uVar3 != 0) && (uVar3 = rectangle::height(in_stack_fffffffffffffe68), uVar3 != 0)) {
      this_00 = (overlay_rect *)&stack0xfffffffffffffe98;
      overlay_rect::overlay_rect<dlib::rgb_alpha_pixel>
                (in_stack_fffffffffffffea8,(rectangle *)in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffeb4,(string *)in_stack_fffffffffffffe98);
      add_overlay(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      overlay_rect::~overlay_rect(this_00);
      bVar1 = any_function<void_(),_void,_0UL>::is_set((any_function<void_(),_void,_0UL> *)0x44c77a)
      ;
      if (bVar1) {
        any_function<void_(),_void,_0UL>::operator()((any_function<void_(),_void,_0UL> *)this_00);
      }
    }
  }
  if ((in_RDI[1].total_rect_.b & 1) != 0) {
    *(undefined1 *)&in_RDI[1].total_rect_.b = 0;
    base_window::invalidate_rectangle(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  }
  if (((ulong)in_RDI[1].hsb.bottom_filler.super_button_action.super_mouse_over_event.super_drawable.
              _vptr_drawable & 0x100) != 0) {
    *(undefined1 *)
     ((long)&in_RDI[1].hsb.bottom_filler.super_button_action.super_mouse_over_event.super_drawable.
             _vptr_drawable + 1) = 0;
  }
  return;
}

Assistant:

void image_display::
    on_mouse_up (
        unsigned long btn,
        unsigned long state,
        long x,
        long y
    )
    {
        scrollable_region::on_mouse_up(btn,state,x,y);

        if (state&base_window::SHIFT)
        {
            holding_shift_key = true;
        }
        else if (holding_shift_key)
        {
            holding_shift_key = false;
            parent.invalidate_rectangle(rect);
        }

        if (drawing_rect && btn == base_window::LEFT && (state&base_window::SHIFT) &&
            !hidden && enabled)
        {
            const point origin(total_rect().tl_corner());
            point c1 = point(x,y) - origin;
            point c2 = rect_anchor - origin;

            if (zoom_in_scale != 1)
            {
                c1 = c1/(double)zoom_in_scale;
                c2 = c2/(double)zoom_in_scale;
            }
            else if (zoom_out_scale != 1)
            {
                c1 = c1*(double)zoom_out_scale;
                c2 = c2*(double)zoom_out_scale;
            }

            rectangle new_rect(c1,c2);
            if (zoom_in_scale != 1)
            {
                // When we are zoomed in we adjust the rectangles a little so they
                // are drown surrounding the pixels inside the rect.  This adjustment
                // is necessary to make this code consistent with this goal.
                new_rect.right() -= 1;
                new_rect.bottom() -= 1;
            }


            if (new_rect.width() > 0 && new_rect.height() > 0)
            {
                add_overlay(overlay_rect(new_rect, default_rect_color, default_rect_label));

                if (event_handler.is_set())
                    event_handler();
            }
        }

        if (drawing_rect)
        {
            drawing_rect = false;
            parent.invalidate_rectangle(rect);
        }
        if (moving_overlay)
        {
            moving_overlay = false;
        }
    }